

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall flatbuffers::StructDef::~StructDef(StructDef *this)

{
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&(this->reserved_ids).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->original_location);
  SymbolTable<flatbuffers::FieldDef>::~SymbolTable(&this->fields);
  Definition::~Definition(&this->super_Definition);
  return;
}

Assistant:

StructDef()
      : fixed(false),
        predecl(true),
        sortbysize(true),
        has_key(false),
        minalign(1),
        bytesize(0) {}